

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::Marray<float,std::allocator<unsigned_long>>::Marray<unsigned_long*>
          (Marray<float,std::allocator<unsigned_long>> *this,unsigned_long *begin,unsigned_long *end
          ,float *value,CoordinateOrder *coordinateOrder,allocator_type *allocator)

{
  float fVar1;
  long lVar2;
  undefined1 auVar3 [16];
  unsigned_long *puVar4;
  float *data;
  runtime_error *this_00;
  ulong uVar5;
  size_type __n;
  long lVar6;
  int iVar8;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined4 *)(this + 0x38) = 1;
  this[0x3c] = (Marray<float,std::allocator<unsigned_long>>)0x1;
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
  __n = 1;
  puVar4 = begin;
  if (begin != end) {
    do {
      __n = __n * *puVar4;
      puVar4 = puVar4 + 1;
    } while (puVar4 != end);
    if (__n == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
      goto LAB_0014b85c;
    }
  }
  data = __gnu_cxx::new_allocator<float>::allocate
                   ((new_allocator<float> *)(this + 0x40),__n,(void *)0x0);
  View<float,false,std::allocator<unsigned_long>>::assign<unsigned_long*>
            ((View<float,false,std::allocator<unsigned_long>> *)this,begin,end,data,coordinateOrder,
             coordinateOrder,allocator);
  auVar3 = _DAT_002380d0;
  lVar2 = *(long *)this;
  fVar1 = *value;
  lVar6 = __n - 1;
  auVar7._8_4_ = (int)lVar6;
  auVar7._0_8_ = lVar6;
  auVar7._12_4_ = (int)((ulong)lVar6 >> 0x20);
  uVar5 = 0;
  auVar7 = auVar7 ^ _DAT_002380d0;
  auVar9 = _DAT_00238070;
  auVar10 = _DAT_00238080;
  do {
    auVar11 = auVar10 ^ auVar3;
    iVar8 = auVar7._4_4_;
    if ((bool)(~(auVar11._4_4_ == iVar8 && auVar7._0_4_ < auVar11._0_4_ || iVar8 < auVar11._4_4_) &
              1)) {
      *(float *)(lVar2 + uVar5 * 4) = fVar1;
    }
    if ((auVar11._12_4_ != auVar7._12_4_ || auVar11._8_4_ <= auVar7._8_4_) &&
        auVar11._12_4_ <= auVar7._12_4_) {
      *(float *)(lVar2 + 4 + uVar5 * 4) = fVar1;
    }
    auVar11 = auVar9 ^ auVar3;
    iVar12 = auVar11._4_4_;
    if (iVar12 <= iVar8 && (iVar12 != iVar8 || auVar11._0_4_ <= auVar7._0_4_)) {
      *(float *)(lVar2 + 8 + uVar5 * 4) = fVar1;
      *(float *)(lVar2 + 0xc + uVar5 * 4) = fVar1;
    }
    uVar5 = uVar5 + 4;
    lVar6 = auVar10._8_8_;
    auVar10._0_8_ = auVar10._0_8_ + 4;
    auVar10._8_8_ = lVar6 + 4;
    lVar6 = auVar9._8_8_;
    auVar9._0_8_ = auVar9._0_8_ + 4;
    auVar9._8_8_ = lVar6 + 4;
  } while ((__n + 3 & 0xfffffffffffffffc) != uVar5);
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
  if (this[0x3c] != (Marray<float,std::allocator<unsigned_long>>)0x0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed.");
LAB_0014b85c:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
Marray<T, A>::Marray
(
    ShapeIterator begin,
    ShapeIterator end,
    const T& value,
    const CoordinateOrder& coordinateOrder,
    const allocator_type& allocator
)
: dataAllocator_(allocator)
{
    std::size_t size = std::accumulate(begin, end, static_cast<std::size_t>(1), 
        std::multiplies<std::size_t>());
    marray_detail::Assert(MARRAY_NO_ARG_TEST || size != 0);
    base::assign(begin, end, dataAllocator_.allocate(size), coordinateOrder, 
        coordinateOrder, allocator); 
    for(std::size_t j=0; j<size; ++j) {
        this->data_[j] = value;
    }
    testInvariant();
}